

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

void __thiscall HEkk::invalidateBasis(HEkk *this)

{
  long in_RDI;
  
  *(undefined1 *)(in_RDI + 0x2554) = 0;
  invalidateBasisArtifacts((HEkk *)0x768155);
  return;
}

Assistant:

void HEkk::invalidateBasis() {
  // Invalidate the basis of the simplex LP, and all its other
  // basis-related properties
  this->status_.has_basis = false;
  this->invalidateBasisArtifacts();
}